

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * getDirectory_abi_cxx11_(void)

{
  ssize_t sVar1;
  string *in_RDI;
  allocator local_435;
  int local_434;
  int local_430;
  int i_1;
  int i;
  allocator local_41d;
  int local_41c;
  char local_418 [4];
  int cnt;
  char abs_path [1024];
  
  sVar1 = readlink("/proc/self/exe",local_418,0x400);
  local_41c = (int)sVar1;
  if ((local_41c < 0) || (local_430 = local_41c, 0x3ff < local_41c)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,(char *)0x0,&local_41d);
    std::allocator<char>::~allocator((allocator<char> *)&local_41d);
    return in_RDI;
  }
  for (; local_434 = local_41c, -1 < local_430; local_430 = local_430 + -1) {
    if (local_418[local_430] == '/') {
      local_418[local_430] = '\0';
      break;
    }
  }
  do {
    if (local_434 < 0) {
LAB_0011402d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,local_418,&local_435);
      std::allocator<char>::~allocator((allocator<char> *)&local_435);
      return in_RDI;
    }
    if (local_418[local_434] == '/') {
      local_418[local_434] = '\0';
      goto LAB_0011402d;
    }
    local_434 = local_434 + -1;
  } while( true );
}

Assistant:

string getDirectory() {
  char abs_path[1024];
  //获取可执行程序的绝对路径
  int cnt = readlink("/proc/self/exe", abs_path, 1024);
  if (cnt < 0 || cnt >= 1024) {
    return NULL;
  }

  //最后一个'/' 后面是可执行程序名，去掉devel/lib/m100/exe，只保留前面部分路径
  for (int i = cnt; i >= 0; --i) {
    if (abs_path[i] == '/') {
      abs_path[i] = '\0';
      break;
    }
  }
  for (int i = cnt; i >= 0; --i) {
    if (abs_path[i] == '/') {
      abs_path[i] = '\0';
      break;
    }
  }
  return string(abs_path);
}